

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O1

void __thiscall
Environment::Environment
          (Environment *this,
          unordered_map<ResultValueType,_EnvironmentScope,_std::hash<ResultValueType>,_std::equal_to<ResultValueType>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>_>
          *scopes)

{
  size_t sVar1;
  undefined4 uVar2;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_ResultValueType,_EnvironmentScope>,_true>_>_>
  local_8;
  
  (this->mScopes)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->mScopes)._M_h._M_bucket_count = (scopes->_M_h)._M_bucket_count;
  (this->mScopes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mScopes)._M_h._M_element_count = (scopes->_M_h)._M_element_count;
  uVar2 = *(undefined4 *)&(scopes->_M_h)._M_rehash_policy.field_0x4;
  sVar1 = (scopes->_M_h)._M_rehash_policy._M_next_resize;
  (this->mScopes)._M_h._M_rehash_policy._M_max_load_factor =
       (scopes->_M_h)._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->mScopes)._M_h._M_rehash_policy.field_0x4 = uVar2;
  (this->mScopes)._M_h._M_rehash_policy._M_next_resize = sVar1;
  (this->mScopes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_8._M_h = (__hashtable_alloc *)this;
  std::
  _Hashtable<ResultValueType,std::pair<ResultValueType_const,EnvironmentScope>,std::allocator<std::pair<ResultValueType_const,EnvironmentScope>>,std::__detail::_Select1st,std::equal_to<ResultValueType>,std::hash<ResultValueType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<ResultValueType,std::pair<ResultValueType_const,EnvironmentScope>,std::allocator<std::pair<ResultValueType_const,EnvironmentScope>>,std::__detail::_Select1st,std::equal_to<ResultValueType>,std::hash<ResultValueType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<ResultValueType_const,EnvironmentScope>,true>>>>
            ((_Hashtable<ResultValueType,std::pair<ResultValueType_const,EnvironmentScope>,std::allocator<std::pair<ResultValueType_const,EnvironmentScope>>,std::__detail::_Select1st,std::equal_to<ResultValueType>,std::hash<ResultValueType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this,&scopes->_M_h,&local_8);
  return;
}

Assistant:

Environment::Environment(std::unordered_map<ResultValueType, EnvironmentScope> scopes)
	 : mScopes(scopes) {

}